

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

bool __thiscall t_rs_generator::can_generate_simple_const(t_rs_generator *this,t_type *ttype)

{
  uint uVar1;
  t_base tVar2;
  t_base_type *this_00;
  t_base_type *tbase_type;
  t_type *actual_type;
  t_type *ttype_local;
  t_rs_generator *this_local;
  
  this_00 = (t_base_type *)t_generator::get_true_type(ttype);
  uVar1 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    tVar2 = t_base_type::get_base(this_00);
    this_local._7_1_ = tVar2 != TYPE_DOUBLE;
  }
  return this_local._7_1_;
}

Assistant:

bool t_rs_generator::can_generate_simple_const(t_type* ttype) {
  t_type* actual_type = get_true_type(ttype);
  if (actual_type->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)actual_type;
    return !(tbase_type->get_base() == t_base_type::TYPE_DOUBLE);
  } else {
    return false;
  }
}